

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O1

u_int64_t __thiscall
CoreML::MilStoragePython::MilStoragePythonWriter::write_int4_data
          (MilStoragePythonWriter *this,array_t<signed_char,_16> *data)

{
  PyObject *pPVar1;
  uint64_t uVar2;
  PyObject *pPVar3;
  SpanSize<18446744073709551615UL> SVar4;
  pointer ptVar5;
  long lVar6;
  Util *this_00;
  SpanSize<18446744073709551615UL> SVar7;
  Span<const_signed_char,_18446744073709551615UL> unpackedValues;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  Span<const_MILBlob::Int4,_18446744073709551615UL> data_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packedValues;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  pPVar3 = (data->super_array).super_buffer.super_object.super_handle.m_ptr;
  ptVar5 = (pointer)pPVar3[1].ob_refcnt;
  SVar7.m_size = 1;
  SVar4.m_size = 1;
  if ((long)*(int *)&pPVar3[1].ob_type != 0) {
    lVar6 = 0;
    do {
      SVar4.m_size = SVar4.m_size * *(long *)(pPVar3[2].ob_refcnt + lVar6);
      lVar6 = lVar6 + 8;
    } while ((long)*(int *)&pPVar3[1].ob_type * 8 != lVar6);
  }
  if (SVar4.m_size == 0) {
    ptVar5 = (pointer)0x0;
  }
  unpackedValues.m_size.m_size = SVar4.m_size;
  unpackedValues.m_ptr = ptVar5;
  MILBlob::PackInt8Span<MILBlob::Int4>(&local_38,unpackedValues);
  span.m_ptr = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  this_00 = (Util *)0x0;
  if (span.m_ptr != (pointer)0x0) {
    this_00 = (Util *)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  }
  pPVar3 = (data->super_array).super_buffer.super_object.super_handle.m_ptr;
  pPVar1 = pPVar3 + 1;
  if ((long)*(int *)&pPVar1->ob_type != 0) {
    pPVar3 = (PyObject *)pPVar3[2].ob_refcnt;
    SVar7.m_size = 1;
    lVar6 = 0;
    do {
      SVar7.m_size = SVar7.m_size * *(long *)((long)&pPVar3->ob_refcnt + lVar6);
      lVar6 = lVar6 + 8;
    } while ((long)*(int *)&pPVar1->ob_type * 8 != lVar6);
  }
  span.m_size.m_size = SVar7.m_size;
  data_00 = MILBlob::Util::CastToBitSpan<const_MILBlob::Int4,_const_unsigned_char,_true>
                      (this_00,span,(size_t)pPVar3);
  uVar2 = MILBlob::Blob::StorageWriter::WriteData<MILBlob::Int4>
                    ((this->m_writer)._M_t.
                     super___uniq_ptr_impl<MILBlob::Blob::StorageWriter,_std::default_delete<MILBlob::Blob::StorageWriter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter_*,_std::default_delete<MILBlob::Blob::StorageWriter>_>
                     .super__Head_base<0UL,_MILBlob::Blob::StorageWriter_*,_false>._M_head_impl,
                     data_00);
  if ((Util *)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (Util *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

u_int64_t MilStoragePythonWriter::write_int4_data(const py::array_t<int8_t>& data) {
    // The `data` is stored in int8 because numpy doesn't support int4.
    // First pack those int4 data into uint8 Span, and then cast to int4 Span and write it.
    auto int8SpanData = MILBlob::Util::Span<const int8_t>(data.data(), data.size());
    std::vector<uint8_t> packedValues = MILBlob::PackInt8Span<MILBlob::Int4>(int8SpanData);
    auto packedValuesSpan = MILBlob::Util::Span<const uint8_t>(packedValues.data(), packedValues.size());
    auto int4Span = MILBlob::Util::CastToBitSpan<const MILBlob::Int4>(packedValuesSpan, data.size());
    return m_writer->WriteData<MILBlob::Int4>(int4Span);
}